

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O1

void __thiscall depspawn::internal::Workitem::Workitem(Workitem *this,arg_info *iargs,int nargs)

{
  Workitem *pWVar1;
  long in_FS_OFFSET;
  
  this->_vptr_Workitem = (_func_int **)&PTR__Workitem_00113920;
  this->status = Filling;
  this->optFlags_ = 0;
  this->deps_mutex_ = (__atomic_flag_base)0x0;
  this->guard_ = (__atomic_base<char>)0x0;
  this->nargs_ = (char)nargs;
  this->args = iargs;
  this->next = (Workitem *)0x0;
  pWVar1 = *(Workitem **)(in_FS_OFFSET + -8);
  this->father = pWVar1;
  this->ndependencies = (__atomic_base<int>)0x0;
  this->nchildren = (__atomic_base<int>)0x1;
  this->task = (AbstractRunner *)0x0;
  this->deps = (_dep *)0x0;
  this->lastdep = (_dep *)0x0;
  if (pWVar1 != (Workitem *)0x0) {
    LOCK();
    (pWVar1->nchildren).super___atomic_base<int>._M_i =
         (pWVar1->nchildren).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

Workitem::Workitem(arg_info *iargs, int nargs) :
    status(Status_t::Filling), optFlags_(0),
    guard_(0), nargs_(static_cast<char>(nargs)),
    args(iargs), next(nullptr), father(enum_thr_spec_father),
    ndependencies(0), nchildren(1),
    task(nullptr), deps(nullptr), lastdep(nullptr)
    {
      if(father)
        father->nchildren.fetch_add(1);
    }